

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O3

Error __thiscall
asmjit::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneAllocator *allocator,uint32_t newSize,uint32_t idealCapacity,
          bool newBitsValue)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sbyte sVar3;
  uint uVar4;
  Error EVar5;
  sbyte sVar6;
  ulong uVar7;
  BitWord BVar8;
  uint uVar9;
  ulong unaff_RBX;
  ulong uVar10;
  uint unaff_EBP;
  CodeHolder *this_00;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ZoneBitVector *unaff_R12;
  BitWord *unaff_R14;
  BitWord *unaff_R15;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  size_t allocatedCapacity;
  byte local_54;
  ulong local_50;
  BaseAssembler *local_48;
  CodeHolder *local_40;
  ulong local_38;
  
  if (idealCapacity < newSize) {
    _resize();
    this_00 = (CodeHolder *)allocator;
    newBitsValue = (bool)local_54;
LAB_00123a64:
    _resize();
LAB_00123a69:
    uVar10 = (ulong)unaff_EBP;
LAB_00123866:
    uVar4 = (int)unaff_RBX + 0x3f;
    if (0x3f < uVar4) {
      uVar7 = 0;
      do {
        unaff_R14[uVar7] = unaff_R15[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 >> 6 != uVar7);
LAB_0012389f:
      if ((local_48->super_BaseEmitter)._vptr_BaseEmitter == (_func_int **)0x0) {
        _resize();
      }
      else {
        uVar4 = unaff_R12->_capacity;
        if (7 < uVar4) {
          uVar7 = (ulong)(uVar4 >> 3);
          if (uVar4 < 0x1008) {
            if (uVar4 < 0x408) {
              uVar7 = uVar7 + 0x1fffffffff >> 5;
            }
            else {
              uVar7 = (uVar7 + 0x3fffffff7f >> 6) + 4;
            }
            *unaff_R15 = *(BitWord *)
                          (&(local_48->super_BaseEmitter)._emitterType + (uVar7 & 0xffffffff) * 8);
            *(BitWord **)(&(local_48->super_BaseEmitter)._emitterType + (uVar7 & 0xffffffff) * 8) =
                 unaff_R15;
          }
          else {
            ZoneAllocator::_releaseDynamic((ZoneAllocator *)local_48,unaff_R15,uVar7);
          }
          goto LAB_00123910;
        }
      }
      _resize();
      goto LAB_00123a7b;
    }
    if (unaff_R15 != (BitWord *)0x0) goto LAB_0012389f;
LAB_00123910:
    unaff_R12->_data = unaff_R14;
    unaff_R12->_capacity = (uint32_t)uVar10;
    this_00 = local_40;
    uVar7 = local_50;
    unaff_R15 = unaff_R14;
  }
  else {
    uVar7 = (ulong)newSize;
    local_40 = (CodeHolder *)&this->_size;
    unaff_RBX = (ulong)this->_size;
    if (newSize <= this->_size) {
      _resize();
      return 0;
    }
    unaff_R15 = this->_data;
    this_00 = local_40;
    if (this->_capacity < newSize) {
      unaff_EBP = idealCapacity + 0x3f & 0xffffffc0;
      if (unaff_EBP < newSize) {
        return 1;
      }
      unaff_R12 = this;
      if (allocator->_zone == (Zone *)0x0) goto LAB_00123a64;
      this_00 = (CodeHolder *)(ulong)(unaff_EBP >> 3);
      unaff_R14 = (BitWord *)ZoneAllocator::_alloc(allocator,(size_t)this_00,&local_38);
      if (unaff_R14 == (BitWord *)0x0) {
        return 1;
      }
      uVar10 = local_38 * 8;
      local_50 = uVar7;
      local_48 = (BaseAssembler *)allocator;
      if (uVar10 < local_38) goto LAB_00123a69;
      goto LAB_00123866;
    }
  }
  local_48 = (BaseAssembler *)(unaff_RBX >> 6 & 0x3ffffff);
  uVar4 = (uint)local_48;
  uVar13 = (uint)uVar7;
  sVar3 = (sbyte)(uVar13 & 0x3f);
  BVar8 = -(ulong)newBitsValue;
  uVar9 = (uint)unaff_RBX & 0x3f;
  if ((unaff_RBX & 0x3f) != 0) {
    sVar6 = 0;
    if ((uVar4 == ((uint)(uVar7 >> 6) & 0x3ffffff)) && (sVar6 = sVar3, (uVar13 & 0x3f) <= uVar9)) {
LAB_00123a7b:
      _resize();
      BaseAssembler::BaseAssembler(local_48);
      (local_48->super_BaseEmitter)._vptr_BaseEmitter = (_func_int **)&PTR__Assembler_00154928;
      if (this_00 == (CodeHolder *)0x0) {
        return 0x154928;
      }
      EVar5 = CodeHolder::attach(this_00,&local_48->super_BaseEmitter);
      return EVar5;
    }
    unaff_R15[(long)local_48] = unaff_R15[(long)local_48] | BVar8 << (sVar6 - (char)uVar9 & 0x3fU);
    uVar4 = uVar4 + 1;
  }
  auVar2 = _DAT_00137910;
  auVar1 = _DAT_00137900;
  uVar9 = uVar13 + 0x3f >> 6;
  if (uVar4 < uVar9) {
    uVar11 = (ulong)uVar4;
    lVar12 = (uVar9 - uVar11) + -1;
    auVar14._8_4_ = (int)lVar12;
    auVar14._0_8_ = lVar12;
    auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar10 = 0;
    auVar14 = auVar14 ^ _DAT_00137910;
    do {
      auVar15._8_4_ = (int)uVar10;
      auVar15._0_8_ = uVar10;
      auVar15._12_4_ = (int)(uVar10 >> 0x20);
      auVar15 = (auVar15 | auVar1) ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar15._0_4_ ||
                  auVar14._4_4_ < auVar15._4_4_) & 1)) {
        unaff_R15[uVar11 + uVar10] = BVar8;
      }
      if ((auVar15._12_4_ != auVar14._12_4_ || auVar15._8_4_ <= auVar14._8_4_) &&
          auVar15._12_4_ <= auVar14._12_4_) {
        unaff_R15[uVar11 + uVar10 + 1] = BVar8;
      }
      uVar10 = uVar10 + 2;
    } while (((uVar9 - uVar11) + 1 & 0xfffffffffffffffe) != uVar10);
  }
  if ((uVar7 & 0x3f) != 0) {
    uVar7 = 0;
    if (newBitsValue != false) {
      uVar7 = ~(-1L << sVar3);
    }
    unaff_R15[uVar9 - 1] = uVar7;
  }
  (this_00->_environment)._arch = (char)uVar13;
  (this_00->_environment)._subArch = (char)(uVar13 >> 8);
  (this_00->_environment)._vendor = (char)(uVar13 >> 0x10);
  (this_00->_environment)._platform = (char)(uVar13 >> 0x18);
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneAllocator* allocator, uint32_t newSize, uint32_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newSize);

  if (newSize <= _size) {
    // The size after the resize is lesser than or equal to the current size.
    uint32_t idx = newSize / kBitWordSizeInBits;
    uint32_t bit = newSize % kBitWordSizeInBits;

    // Just set all bits outside of the new size in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newSize` is a multiply of `kBitWordSizeInBits` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_size`.
    if (bit)
      _data[idx] &= (BitWord(1) << bit) - 1u;

    _size = newSize;
    return kErrorOk;
  }

  uint32_t oldSize = _size;
  BitWord* data = _data;

  if (newSize > _capacity) {
    // Realloc needed, calculate the minimum capacity (in bytes) requied.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(idealCapacity, kBitWordSizeInBits);

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    _copyBits(newData, data, _wordsPerBits(oldSize));

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  // Start (of the old size) and end (of the new size) bits
  uint32_t idx = oldSize / kBitWordSizeInBits;
  uint32_t startBit = oldSize % kBitWordSizeInBits;
  uint32_t endBit = newSize % kBitWordSizeInBits;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = Support::bitMaskFromBool<BitWord>(newBitsValue);

  // First initialize the last bit-word of the old size.
  if (startBit) {
    uint32_t nBits = 0;

    if (idx == (newSize / kBitWordSizeInBits)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old size.
      nBits = kBitWordSizeInBits - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old size.
  uint32_t endIdx = _wordsPerBits(newSize);
  while (idx < endIdx) data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx - 1] = pattern & ((BitWord(1) << endBit) - 1);

  _size = newSize;
  return kErrorOk;
}